

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createSLen(IRBuilder *this,Value *value,string *name)

{
  int64_t literal;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_98;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_30;
  ConstantString *a;
  string *name_local;
  Value *value_local;
  IRBuilder *this_local;
  
  a = (ConstantString *)name;
  name_local = (string *)value;
  value_local = (Value *)this;
  if (value == (Value *)0x0) {
    local_98 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                *)0x0;
  }
  else {
    local_98 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                *)__dynamic_cast(value,&Value::typeinfo,
                                 &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo
                                 ,0);
  }
  local_30 = local_98;
  if (local_98 ==
      (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
       *)0x0) {
    makeName(&local_80,this,(string *)a);
    this_local = (IRBuilder *)
                 insert<flow::UnaryInstr<(flow::UnaryOperator)3,(flow::LiteralType)2>,flow::Value*&,std::__cxx11::string>
                           (this,(Value **)&name_local,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
    ::get(&local_50,local_98);
    literal = std::__cxx11::string::size();
    this_local = (IRBuilder *)get(this,literal);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (Value *)this_local;
}

Assistant:

Value* IRBuilder::createSLen(Value* value, const std::string& name) {
  if (auto a = dynamic_cast<ConstantString*>(value))
    return get(a->get().size());

  return insert<SLenInstr>(value, makeName(name));
}